

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O1

Port * __thiscall rtosc::MidiMapperRT::addWatchPort(MidiMapperRT *this)

{
  Port *in_RDI;
  
  in_RDI->name = "midi-add-watch";
  in_RDI->metadata = "";
  in_RDI->ports = (Ports *)0x0;
  *(undefined8 *)&(in_RDI->cb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(in_RDI->cb).super__Function_base._M_functor + 8) = 0;
  (in_RDI->cb).super__Function_base._M_manager = (_Manager_type)0x0;
  *(MidiMapperRT **)&(in_RDI->cb).super__Function_base._M_functor = this;
  (in_RDI->cb)._M_invoker =
       std::
       _Function_handler<void_(const_char_*,_rtosc::RtData_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fundamental[P]rtosc/src/cpp/midimapper.cpp:607:40)>
       ::_M_invoke;
  (in_RDI->cb).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_char_*,_rtosc::RtData_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fundamental[P]rtosc/src/cpp/midimapper.cpp:607:40)>
       ::_M_manager;
  return in_RDI;
}

Assistant:

Port MidiMapperRT::addWatchPort(void) {
    return Port{"midi-add-watch","",0, [this](msg_t, RtData&) {
        this->addWatch();
    }};
}